

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O3

void ncnn::resize_bilinear_c3
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  long lVar1;
  int iVar2;
  long lVar3;
  float fVar4;
  short b0;
  int iVar5;
  int *piVar6;
  short *psVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  short *rows0_old;
  short *psVar12;
  short *rows0p;
  int *piVar13;
  long lVar14;
  int *piVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  Mat local_c8;
  Mat local_78;
  
  uVar20 = (h + w) * 2;
  uVar19 = 0xffffffffffffffff;
  if (-1 < (int)uVar20) {
    uVar19 = (ulong)uVar20 * 4;
  }
  piVar6 = (int *)operator_new__(uVar19);
  lVar8 = (long)w;
  lVar9 = (long)h;
  if (0 < w) {
    uVar19 = 0;
    do {
      fVar4 = ((float)(int)uVar19 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
      fVar21 = floorf(fVar4);
      iVar5 = (int)fVar21;
      fVar24 = 0.0;
      iVar11 = iVar5;
      if (iVar5 < 1) {
        iVar11 = 0;
      }
      if (-1 < iVar5) {
        fVar24 = (fVar4 - (float)(int)fVar21) * 2048.0;
      }
      iVar5 = iVar11;
      if (srcw + -1 <= iVar11) {
        iVar5 = srcw + -2;
      }
      piVar6[uVar19] = iVar5 * 3;
      if (srcw + -1 <= iVar11) {
        fVar24 = 2048.0;
      }
      uVar20 = -(uint)(0.0 <= 2048.0 - fVar24);
      auVar22._0_4_ = (int)((float)(uVar20 & 0x3f000000 | ~uVar20 & 0xbf000000) + (2048.0 - fVar24))
      ;
      auVar22._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar24) & 0x3f000000 | ~-(uint)(0.0 <= fVar24) & 0xbf000000)
                + fVar24);
      auVar22._8_8_ = 0;
      auVar22 = packssdw(auVar22,auVar22);
      piVar6[lVar8 + lVar9 + uVar19] = auVar22._0_4_;
      uVar19 = uVar19 + 1;
    } while ((uint)w != uVar19);
  }
  piVar15 = piVar6 + lVar9 + lVar8 * 2;
  if (0 < h) {
    uVar19 = 0;
    do {
      fVar4 = ((float)(int)uVar19 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
      fVar21 = floorf(fVar4);
      iVar5 = (int)fVar21;
      fVar24 = 0.0;
      iVar11 = iVar5;
      if (iVar5 < 1) {
        iVar11 = 0;
      }
      if (-1 < iVar5) {
        fVar24 = (fVar4 - (float)(int)fVar21) * 2048.0;
      }
      iVar5 = iVar11;
      if (srch + -1 <= iVar11) {
        iVar5 = srch + -2;
      }
      piVar6[lVar8 + uVar19] = iVar5;
      if (srch + -1 <= iVar11) {
        fVar24 = 2048.0;
      }
      uVar20 = -(uint)(0.0 <= 2048.0 - fVar24);
      auVar23._0_4_ = (int)((float)(uVar20 & 0x3f000000 | ~uVar20 & 0xbf000000) + (2048.0 - fVar24))
      ;
      auVar23._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar24) & 0x3f000000 | ~-(uint)(0.0 <= fVar24) & 0xbf000000)
                + fVar24);
      auVar23._8_8_ = 0;
      auVar22 = packssdw(auVar23,auVar23);
      piVar15[uVar19] = auVar22._0_4_;
      uVar19 = uVar19 + 1;
    } while ((uint)h != uVar19);
  }
  iVar11 = w * 3 + 1;
  local_c8.cstep = 0;
  local_c8.data = (short *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,iVar11,2,(Allocator *)0x0);
  local_78.cstep = 0;
  local_78.data = (short *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,iVar11,2,(Allocator *)0x0);
  if (0 < h) {
    lVar3 = (ulong)(uint)w * 6;
    lVar1 = lVar9 * 4 + lVar8 * 4;
    iVar11 = 0;
    psVar7 = (short *)local_78.data;
    psVar12 = (short *)local_c8.data;
    iVar5 = -2;
    do {
      iVar2 = piVar6[lVar8 + iVar11];
      rows0p = psVar12;
      if (iVar2 != iVar5) {
        if (iVar2 == iVar5 + 1) {
          rows0p = psVar7;
          psVar7 = psVar12;
          if (0 < w) {
            iVar5 = (iVar2 + 1) * srcstride;
            lVar10 = 0;
            piVar13 = piVar6;
            do {
              lVar14 = (long)*piVar13;
              iVar16 = (int)(short)piVar13[lVar8 + lVar9];
              iVar17 = (int)*(short *)((long)piVar13 + lVar1 + 2);
              *(short *)((long)psVar12 + lVar10) =
                   (short)((uint)src[lVar14 + (long)iVar5 + 3] * iVar17 +
                           (uint)src[lVar14 + iVar5] * iVar16 >> 4);
              *(short *)((long)psVar12 + lVar10 + 2) =
                   (short)((uint)src[lVar14 + (long)iVar5 + 4] * iVar17 +
                           (uint)src[lVar14 + (long)iVar5 + 1] * iVar16 >> 4);
              *(short *)((long)psVar12 + lVar10 + 4) =
                   (short)((uint)src[lVar14 + (long)iVar5 + 5] * iVar17 +
                           (uint)src[lVar14 + (long)iVar5 + 2] * iVar16 >> 4);
              piVar13 = piVar13 + 1;
              lVar10 = lVar10 + 6;
            } while (lVar3 != lVar10);
          }
        }
        else if (0 < w) {
          iVar5 = iVar2 * srcstride;
          iVar16 = (iVar2 + 1) * srcstride;
          lVar10 = 0;
          piVar13 = piVar6;
          do {
            lVar14 = (long)*piVar13;
            iVar18 = (int)(short)piVar13[lVar8 + lVar9];
            iVar17 = (int)*(short *)((long)piVar13 + lVar1 + 2);
            *(short *)((long)psVar12 + lVar10) =
                 (short)((uint)src[lVar14 + (long)iVar5 + 3] * iVar17 +
                         (uint)src[lVar14 + iVar5] * iVar18 >> 4);
            *(short *)((long)psVar12 + lVar10 + 2) =
                 (short)((uint)src[lVar14 + (long)iVar5 + 4] * iVar17 +
                         (uint)src[lVar14 + (long)iVar5 + 1] * iVar18 >> 4);
            *(short *)((long)psVar12 + lVar10 + 4) =
                 (short)((uint)src[lVar14 + (long)iVar5 + 5] * iVar17 +
                         (uint)src[lVar14 + (long)iVar5 + 2] * iVar18 >> 4);
            *(short *)((long)psVar7 + lVar10) =
                 (short)((uint)src[lVar14 + (long)iVar16 + 3] * iVar17 +
                         (uint)src[lVar14 + iVar16] * iVar18 >> 4);
            *(short *)((long)psVar7 + lVar10 + 2) =
                 (short)((uint)src[lVar14 + (long)iVar16 + 4] * iVar17 +
                         (uint)src[lVar14 + (long)iVar16 + 1] * iVar18 >> 4);
            *(short *)((long)psVar7 + lVar10 + 4) =
                 (short)((uint)src[lVar14 + (long)iVar16 + 5] * iVar17 +
                         (uint)src[lVar14 + (long)iVar16 + 2] * iVar18 >> 4);
            piVar13 = piVar13 + 1;
            lVar10 = lVar10 + 6;
          } while (lVar3 != lVar10);
        }
      }
      iVar5 = iVar11 + 1;
      if (iVar5 < h) {
        b0 = (short)*piVar15;
        if (piVar6[lVar8 + iVar5] != iVar2) goto LAB_0012e302;
        vresize_two(rows0p,psVar7,w * 3,dst + iVar11 * stride,dst + iVar5 * stride,b0,
                    *(short *)((long)piVar15 + 2),(short)piVar15[1],*(short *)((long)piVar15 + 6));
        piVar15 = piVar15 + 2;
        iVar11 = iVar11 + 2;
      }
      else {
        b0 = (short)*piVar15;
LAB_0012e302:
        vresize_one(rows0p,psVar7,w * 3,dst + iVar11 * stride,b0,*(short *)((long)piVar15 + 2));
        piVar15 = piVar15 + 1;
        iVar11 = iVar5;
      }
      psVar12 = rows0p;
      iVar5 = iVar2;
    } while (iVar11 < h);
  }
  operator_delete__(piVar6);
  piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((short *)local_78.data != (short *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((short *)local_c8.data != (short *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear_c3(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx * 3;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w * 3 + 1, (size_t)2u);
    Mat rowsbuf1(w * 3 + 1, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S1 = uint8x8_t();

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);
                _S1 = vld1_lane_u8(S1p + 4, _S1, 4);
                _S1 = vld1_lane_u8(S1p + 5, _S1, 5);

                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S1high = vext_s16(_S1low, vget_high_s16(_S116), 3);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows1p[0] = (S1p[0] * a0 + S1p[3] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[4] * a1) >> 4;
                rows1p[2] = (S1p[2] * a0 + S1p[5] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows1p += 3;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = src + srcstride * (sy);
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
#if __ARM_NEON
                int16x4_t _a0 = vdup_n_s16(a0);
                int16x4_t _a1 = vdup_n_s16(a1);
                uint8x8_t _S0 = uint8x8_t();
                uint8x8_t _S1 = uint8x8_t();

                _S0 = vld1_lane_u8(S0p, _S0, 0);
                _S0 = vld1_lane_u8(S0p + 1, _S0, 1);
                _S0 = vld1_lane_u8(S0p + 2, _S0, 2);
                _S0 = vld1_lane_u8(S0p + 3, _S0, 3);
                _S0 = vld1_lane_u8(S0p + 4, _S0, 4);
                _S0 = vld1_lane_u8(S0p + 5, _S0, 5);

                _S1 = vld1_lane_u8(S1p, _S1, 0);
                _S1 = vld1_lane_u8(S1p + 1, _S1, 1);
                _S1 = vld1_lane_u8(S1p + 2, _S1, 2);
                _S1 = vld1_lane_u8(S1p + 3, _S1, 3);
                _S1 = vld1_lane_u8(S1p + 4, _S1, 4);
                _S1 = vld1_lane_u8(S1p + 5, _S1, 5);

                int16x8_t _S016 = vreinterpretq_s16_u16(vmovl_u8(_S0));
                int16x8_t _S116 = vreinterpretq_s16_u16(vmovl_u8(_S1));
                int16x4_t _S0low = vget_low_s16(_S016);
                int16x4_t _S1low = vget_low_s16(_S116);
                int16x4_t _S0high = vext_s16(_S0low, vget_high_s16(_S016), 3);
                int16x4_t _S1high = vext_s16(_S1low, vget_high_s16(_S116), 3);
                int32x4_t _rows0 = vmull_s16(_S0low, _a0);
                int32x4_t _rows1 = vmull_s16(_S1low, _a0);
                _rows0 = vmlal_s16(_rows0, _S0high, _a1);
                _rows1 = vmlal_s16(_rows1, _S1high, _a1);
                int16x4_t _rows0_sr4 = vshrn_n_s32(_rows0, 4);
                int16x4_t _rows1_sr4 = vshrn_n_s32(_rows1, 4);
                vst1_s16(rows0p, _rows0_sr4);
                vst1_s16(rows1p, _rows1_sr4);
#else
                rows0p[0] = (S0p[0] * a0 + S0p[3] * a1) >> 4;
                rows0p[1] = (S0p[1] * a0 + S0p[4] * a1) >> 4;
                rows0p[2] = (S0p[2] * a0 + S0p[5] * a1) >> 4;
                rows1p[0] = (S1p[0] * a0 + S1p[3] * a1) >> 4;
                rows1p[1] = (S1p[1] * a0 + S1p[4] * a1) >> 4;
                rows1p[2] = (S1p[2] * a0 + S1p[5] * a1) >> 4;
#endif // __ARM_NEON

                ialphap += 2;
                rows0p += 3;
                rows1p += 3;
            }
        }

        prev_sy1 = sy;

        if (dy + 1 < h && yofs[dy + 1] == sy)
        {
            // vresize for two rows
            unsigned char* Dp0 = dst + stride * dy;
            unsigned char* Dp1 = dst + stride * (dy + 1);

            vresize_two(rows0, rows1, w * 3, Dp0, Dp1, ibeta[0], ibeta[1], ibeta[2], ibeta[3]);

            ibeta += 4;
            dy += 1;
        }
        else
        {
            // vresize
            unsigned char* Dp = dst + stride * dy;

            vresize_one(rows0, rows1, w * 3, Dp, ibeta[0], ibeta[1]);

            ibeta += 2;
        }
    }

    delete[] buf;
}